

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O0

void __thiscall absl::lts_20250127::cord_internal::CordzHandle::~CordzHandle(CordzHandle *this)

{
  bool bVar1;
  Queue *mu;
  reference ppCVar2;
  byte local_71;
  CordzHandle *handle;
  iterator __end3;
  iterator __begin3;
  vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
  *__range3;
  CordzHandle *next;
  MutexLock lock;
  vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
  to_delete;
  Queue *global_queue;
  CordzHandle *this_local;
  
  this->_vptr_CordzHandle = (_func_int **)&PTR__CordzHandle_0082df40;
  mu = anon_unknown_0::GlobalQueue();
  if ((this->is_snapshot_ & 1U) != 0) {
    std::
    vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
    ::vector((vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
              *)&lock);
    MutexLock::MutexLock((MutexLock *)&next,&mu->mutex);
    __range3 = (vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                *)this->dq_next_;
    if (this->dq_prev_ == (CordzHandle *)0x0) {
      while( true ) {
        local_71 = 0;
        if (__range3 !=
            (vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
             *)0x0) {
          local_71 = *(byte *)&(__range3->
                               super__Vector_base<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish ^ 0xff;
        }
        if ((local_71 & 1) == 0) break;
        std::
        vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
        ::push_back((vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                     *)&lock,(value_type *)&__range3);
        __range3 = (vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                    *)__range3[1].
                      super__Vector_base<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    else {
      this->dq_prev_->dq_next_ = (CordzHandle *)__range3;
    }
    if (__range3 ==
        (vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
         *)0x0) {
      std::atomic<absl::lts_20250127::cord_internal::CordzHandle_*>::store
                (&mu->dq_tail,this->dq_prev_,memory_order_release);
    }
    else {
      (__range3->
      super__Vector_base<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this->dq_prev_;
    }
    MutexLock::~MutexLock((MutexLock *)&next);
    __end3 = std::
             vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
             ::begin((vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                      *)&lock);
    handle = (CordzHandle *)
             std::
             vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
             ::end((vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                    *)&lock);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<absl::lts_20250127::cord_internal::CordzHandle_**,_std::vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>_>
                                       *)&handle), bVar1) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<absl::lts_20250127::cord_internal::CordzHandle_**,_std::vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>_>
                ::operator*(&__end3);
      if (*ppCVar2 != (CordzHandle *)0x0) {
        (*(*ppCVar2)->_vptr_CordzHandle[1])();
      }
      __gnu_cxx::
      __normal_iterator<absl::lts_20250127::cord_internal::CordzHandle_**,_std::vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
    ::~vector((vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
               *)&lock);
  }
  return;
}

Assistant:

CordzHandle::~CordzHandle() {
  Queue& global_queue = GlobalQueue();
  if (is_snapshot_) {
    std::vector<CordzHandle*> to_delete;
    {
      MutexLock lock(&global_queue.mutex);
      CordzHandle* next = dq_next_;
      if (dq_prev_ == nullptr) {
        // We were head of the queue, delete every CordzHandle until we reach
        // either the end of the list, or a snapshot handle.
        while (next && !next->is_snapshot_) {
          to_delete.push_back(next);
          next = next->dq_next_;
        }
      } else {
        // Another CordzHandle existed before this one, don't delete anything.
        dq_prev_->dq_next_ = next;
      }
      if (next) {
        next->dq_prev_ = dq_prev_;
      } else {
        global_queue.dq_tail.store(dq_prev_, std::memory_order_release);
      }
    }
    for (CordzHandle* handle : to_delete) {
      delete handle;
    }
  }
}